

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemTxResult
address_space_write_rom_mips(AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len)

{
  int iVar1;
  MemoryRegion *mr;
  void *__dest;
  uint8_t *buf_1;
  hwaddr l;
  hwaddr addr1;
  
  for (; len != 0; len = len - l) {
    l = len;
    mr = address_space_translate(as,addr,&addr1,&l,true,attrs);
    if (mr->ram == false) {
      iVar1 = memory_access_size(mr,(uint)l,addr1);
      l = (hwaddr)iVar1;
    }
    else {
      __dest = qemu_map_ram_ptr_mips((uc_struct_conflict4 *)as->uc,mr->ram_block,addr1);
      memcpy(__dest,buf,l);
    }
    buf = (void *)((long)buf + l);
    addr = addr + l;
  }
  return 0;
}

Assistant:

MemTxResult address_space_write_rom(AddressSpace *as, hwaddr addr,
                                    MemTxAttrs attrs,
                                    const void *buf, hwaddr len)
{
    return address_space_write_rom_internal(as, addr, attrs,
                                            buf, len, WRITE_DATA);
}